

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZipReader.cpp
# Opt level: O3

bool __thiscall
irr::io::CArchiveLoaderZIP::isALoadableFileFormat(CArchiveLoaderZIP *this,IReadFile *file)

{
  SZIPFileHeader header;
  uint local_28 [8];
  
  (**file->_vptr_IReadFile)(file,local_28,4);
  return (local_28[0] & 0xffff) == 0x8b1f || local_28[0] == 0x4034b50;
}

Assistant:

bool CArchiveLoaderZIP::isALoadableFileFormat(io::IReadFile *file) const
{
	SZIPFileHeader header;

	file->read(&header.Sig, 4);
#ifdef __BIG_ENDIAN__
	header.Sig = os::Byteswap::byteswap(header.Sig);
#endif

	return header.Sig == 0x04034b50 ||      // ZIP
		   (header.Sig & 0xffff) == 0x8b1f; // gzip
}